

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xml.cpp
# Opt level: O0

bool __thiscall Xml::Private::parse(Private *this,char *data,Element *element)

{
  bool bVar1;
  String local_a8;
  String local_70;
  char *local_48;
  char *end;
  Position startPos;
  Element *element_local;
  char *data_local;
  Private *this_local;
  
  (this->pos).line = 1;
  (this->pos).lineStart = data;
  (this->pos).pos = data;
  startPos.lineStart = (char *)element;
  skipSpace(this);
  while( true ) {
    bVar1 = false;
    if (*(this->pos).pos == '<') {
      bVar1 = (this->pos).pos[1] == '?';
    }
    if (!bVar1) break;
    end = *(char **)&this->pos;
    startPos._0_8_ = (this->pos).pos;
    startPos.pos = (this->pos).lineStart;
    (this->pos).pos = (this->pos).pos + 2;
    while( true ) {
      local_48 = String::findOneOf((this->pos).pos,"\r\n?");
      if (local_48 == (char *)0x0) {
        String::String<23ul>(&local_70,(char (*) [23])"Unexpected end of file");
        syntaxError(this,(Position *)&end,&local_70);
        String::~String(&local_70);
        return false;
      }
      if ((*local_48 == '?') && (local_48[1] == '>')) break;
      (this->pos).pos = local_48 + 1;
      skipSpace(this);
    }
    (this->pos).pos = local_48 + 2;
    skipSpace(this);
  }
  bVar1 = readToken(this);
  if (bVar1) {
    if ((this->token).type == startTagBeginType) {
      this_local._7_1_ = parseElement(this,(Element *)startPos.lineStart);
    }
    else {
      String::String<13ul>(&local_a8,(char (*) [13])"Expected \'<\'");
      syntaxError(this,&(this->token).pos,&local_a8);
      this_local._7_1_ = false;
      String::~String(&local_a8);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Xml::Private::parse(const char* data, Element& element)
{
  pos.line = 1;
  pos.pos = pos.lineStart = data;

  skipSpace();
  while(*pos.pos == '<' && pos.pos[1] == '?')
  {
    Position startPos = pos;
    pos.pos += 2;
    for(;;)
    {
      const char* end = String::findOneOf(pos.pos, "\r\n?");
      if(!end)
        return this->syntaxError(startPos, "Unexpected end of file"), false;
      if(*end == '?' && end[1] == '>')
      {
        pos.pos = end + 2;
        break;
      }
      pos.pos = end + 1;
      skipSpace();
    }
    skipSpace();
  }
  if(!readToken())
    return false;
  if(token.type != Token::startTagBeginType)
    return syntaxError(token.pos, "Expected '<'"), false;
  return parseElement(element);
}